

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::reserve
          (Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *this,size_t capacity)

{
  mat<4,_4,_float,_(glm::qualifier)0> *__dest;
  mat<4,_4,_float,_(glm::qualifier)0> *data;
  size_t capacity_local;
  Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *this_local;
  
  if (this->_capacity < capacity) {
    __dest = (mat<4,_4,_float,_(glm::qualifier)0> *)operator_new__(capacity << 6);
    if (this->_data != (mat<4,_4,_float,_(glm::qualifier)0> *)0x0) {
      memcpy(__dest,this->_data,this->_size << 6);
      if (this->_data != (mat<4,_4,_float,_(glm::qualifier)0> *)0x0) {
        operator_delete__(this->_data);
      }
    }
    this->_data = __dest;
    this->_capacity = capacity;
  }
  return;
}

Assistant:

void Vector<T>::reserve(size_t capacity)noexcept
{
    if(capacity > _capacity) {
        T* data = reinterpret_cast<T*>(new char[sizeof(T) * capacity]);
        if(_data) {
            memcpy(data, _data, _size * sizeof(T));
            delete[] (char*)_data;
        }
        _data = data;
        _capacity = capacity;
    }
}